

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t is_hardlink(char *file,wchar_t line,char *path1,char *path2)

{
  int iVar1;
  bool local_155;
  undefined1 auStack_150 [4];
  wchar_t r;
  stat st2;
  stat st1;
  char *path2_local;
  char *path1_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  iVar1 = lstat(path1,(stat *)(st2.__glibc_reserved + 2));
  if (iVar1 == 0) {
    iVar1 = lstat(path2,(stat *)auStack_150);
    if (iVar1 == 0) {
      local_155 = st1.st_dev == st2.st_dev && st2.__glibc_reserved[2] == _auStack_150;
      file_local._4_4_ = (wchar_t)local_155;
    }
    else {
      failure_start(file,line,"File should exist: %s",path2);
      failure_finish((void *)0x0);
      file_local._4_4_ = L'\0';
    }
  }
  else {
    failure_start(file,line,"File should exist: %s",path1);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

static int
is_hardlink(const char *file, int line,
    const char *path1, const char *path2)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi1, bhfi2;
	int r;

	assertion_count(file, line);
	r = my_GetFileInformationByName(path1, &bhfi1);
	if (r == 0) {
		failure_start(file, line, "File %s can't be inspected?", path1);
		failure_finish(NULL);
		return (0);
	}
	r = my_GetFileInformationByName(path2, &bhfi2);
	if (r == 0) {
		failure_start(file, line, "File %s can't be inspected?", path2);
		failure_finish(NULL);
		return (0);
	}
	return (bhfi1.dwVolumeSerialNumber == bhfi2.dwVolumeSerialNumber
		&& bhfi1.nFileIndexHigh == bhfi2.nFileIndexHigh
		&& bhfi1.nFileIndexLow == bhfi2.nFileIndexLow);
#else
	struct stat st1, st2;
	int r;

	assertion_count(file, line);
	r = lstat(path1, &st1);
	if (r != 0) {
		failure_start(file, line, "File should exist: %s", path1);
		failure_finish(NULL);
		return (0);
	}
	r = lstat(path2, &st2);
	if (r != 0) {
		failure_start(file, line, "File should exist: %s", path2);
		failure_finish(NULL);
		return (0);
	}
	return (st1.st_ino == st2.st_ino && st1.st_dev == st2.st_dev);
#endif
}